

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O3

int __thiscall sparse_tree::B(sparse_tree *this,int l,int j)

{
  pointer pNVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  pNVar1 = (this->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = -2;
  if (((((pNVar1[l].parent)->index != 0) && (pNVar1[l].pair < 0)) &&
      (iVar3 = -1, (pNVar1[l].parent)->pair <= j)) && (iVar2 = LCA(this,l,j), iVar3 = j, iVar2 != j)
     ) {
    for (piVar4 = *(int **)&pNVar1[iVar2].children.super__Vector_base<int,_std::allocator<int>_>;
        piVar4 != *(pointer *)
                   ((long)&pNVar1[iVar2].children.super__Vector_base<int,_std::allocator<int>_> + 8)
        ; piVar4 = piVar4 + 1) {
      if ((*piVar4 < j) && (l < pNVar1[*piVar4].pair)) {
        return pNVar1[*piVar4].pair;
      }
    }
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

const int sparse_tree::B(int l, int j) const{
    if(tree[l].parent->index == 0 || tree[l].pair > -1) return -2;
    if ((tree[l].parent)->pair > j) return -1;
    else{
        int lca = LCA(l,j);
        if(j == lca) return j;
        for(int x:tree[lca].children){
            if(x<j && tree[x].pair > l) return tree[x].pair;
        }
        return -100;
    }
}